

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.hpp
# Opt level: O3

void __thiscall pg::SPMSolver::todo_push(SPMSolver *this,int node)

{
  int *piVar1;
  int *piVar2;
  ostream *poVar3;
  long lVar4;
  int local_14;
  
  lVar4 = (long)node;
  piVar2 = this->dirty;
  if (piVar2[lVar4] == 0) {
    piVar1 = (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    local_14 = node;
    if (piVar1 == (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)&this->todo,&local_14);
      piVar2 = this->dirty;
      lVar4 = (long)local_14;
    }
    else {
      *piVar1 = node;
      (this->todo).super__Deque_base<int,_std::allocator<int>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur = piVar1 + 1;
    }
    piVar2[lVar4] = 1;
    if (1 < (this->super_Solver).trace) {
      poVar3 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"push(",5);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void todo_push(int node) {
        if (dirty[node]) return;
        todo.push_back(node);
        dirty[node] = 1;
#ifndef NDEBUG
        if (trace >= 2) logger << "push(" << node << ")" << std::endl;
#endif
    }